

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPrivateKey.cpp
# Opt level: O0

void __thiscall OSSLRSAPrivateKey::~OSSLRSAPrivateKey(OSSLRSAPrivateKey *this)

{
  RSAPrivateKey *in_RDI;
  
  (in_RDI->super_PrivateKey).super_Serialisable._vptr_Serialisable =
       (_func_int **)&PTR_serialise_0017c8f8;
  RSA_free((RSA *)in_RDI[1].super_PrivateKey.super_Serialisable._vptr_Serialisable);
  RSAPrivateKey::~RSAPrivateKey(in_RDI);
  return;
}

Assistant:

OSSLRSAPrivateKey::~OSSLRSAPrivateKey()
{
	RSA_free(rsa);
}